

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O3

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver6L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *__return_storage_ptr__,
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                       *plPair,
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                      *lCPair)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  iterator __position;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  DenseStorage<float,_6,_6,_1,_0> *pDVar9;
  byte bVar10;
  float *pfVar11;
  uint iter;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  Scalar SVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  Matrix<float,_3,_1,_0,_3,_1> R62_B;
  Matrix<float,_3,_1,_0,_3,_1> R61_B;
  Matrix<float,_3,_1,_0,_3,_1> Q62;
  Matrix<float,_3,_1,_0,_3,_1> Q61;
  Matrix<float,_3,_1,_0,_3,_1> R52_B;
  Matrix<float,_3,_1,_0,_3,_1> R51_B;
  Matrix<float,_3,_1,_0,_3,_1> Q52;
  Matrix<float,_3,_1,_0,_3,_1> Q51;
  Matrix<float,_3,_1,_0,_3,_1> R42_B;
  Matrix<float,_3,_1,_0,_3,_1> R41_B;
  Matrix<float,_3,_1,_0,_3,_1> Q42;
  Matrix<float,_3,_1,_0,_3,_1> Q41;
  Matrix<float,_3,_1,_0,_3,_1> R32_B;
  Matrix<float,_3,_1,_0,_3,_1> R31_B;
  Matrix<float,_3,_1,_0,_3,_1> Q32;
  Matrix<float,_3,_1,_0,_3,_1> Q31;
  Matrix<float,_3,_1,_0,_3,_1> R22_B;
  Matrix<float,_3,_1,_0,_3,_1> R21_B;
  Matrix<float,_3,_1,_0,_3,_1> Q22;
  Matrix<float,_3,_1,_0,_3,_1> Q21;
  Matrix<float,_3,_1,_0,_3,_1> R12_B;
  Matrix<float,_3,_1,_0,_3,_1> R11_B;
  Matrix<float,_6,_6,_0,_6,_6> L1;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L1vec;
  Matrix<float,_4,_4,_0,_4,_4> TransformationEstimate;
  Matrix<float,_3,_1,_0,_3,_1> Q12;
  Matrix<float,_3,_1,_0,_3,_1> Q11;
  Matrix<float,_6,_6,_0,_6,_6> L2;
  SrcEvaluatorType srcEvaluator;
  Matrix<float,_3,_1,_0,_3,_1> solution;
  SrcEvaluatorType srcEvaluator_12;
  Matrix<float,_6,_1,_0,_6,_1> k;
  Matrix<float,_6,_3,_0,_6,_3> A;
  Matrix<float,_64,_64,_0,_64,_64> Action;
  EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> Eig;
  Matrix<std::complex<float>,_64,_64,_0,_64,_64> EV;
  assign_op<float,_float> aStack_20d29;
  ulong uStack_20d28;
  undefined1 auStack_20d1c [16];
  float fStack_20d0c;
  float fStack_20d08;
  undefined1 auStack_20d04 [16];
  float fStack_20cf4;
  float fStack_20cf0;
  undefined1 auStack_20cec [16];
  float fStack_20cdc;
  float fStack_20cd8;
  undefined1 auStack_20cd4 [16];
  float fStack_20cc4;
  float fStack_20cc0;
  undefined1 auStack_20cbc [16];
  float fStack_20cac;
  float fStack_20ca8;
  undefined1 auStack_20ca4 [16];
  float fStack_20c94;
  float fStack_20c90;
  undefined1 auStack_20c8c [16];
  float fStack_20c7c;
  float fStack_20c78;
  undefined1 auStack_20c74 [16];
  float fStack_20c64;
  float fStack_20c60;
  undefined1 auStack_20c5c [16];
  float fStack_20c4c;
  float fStack_20c48;
  undefined1 auStack_20c44 [16];
  float fStack_20c34;
  float fStack_20c30;
  undefined1 auStack_20c2c [16];
  float fStack_20c1c;
  float fStack_20c18;
  Matrix<float,_3,_3,_0,_3,_3> MStack_20c14;
  complex<float> *pcStack_20bf0;
  undefined1 auStack_20be8 [16];
  ulong uStack_20bd8;
  float afStack_20bd0 [2];
  float afStack_20bc8 [2];
  ulong uStack_20bc0;
  float afStack_20bb8 [2];
  float afStack_20bb0 [2];
  ulong uStack_20ba8;
  float afStack_20ba0 [2];
  float afStack_20b98 [2];
  ulong uStack_20b90;
  float afStack_20b88 [2];
  float afStack_20b80 [2];
  ulong uStack_20b78;
  undefined1 auStack_20b70 [16];
  float afStack_20b60 [2];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  vStack_20b58;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  vStack_20b38;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20b18;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20af8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20ad8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20ab8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20a98;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20a78;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20a58;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20a38;
  Matrix<float,_6,_1,_0,_6,_1> MStack_20a18;
  undefined1 auStack_209f8 [16];
  ulong uStack_209e8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_209d8;
  Matrix<float,_4,_4,_0,_4,_4> MStack_209b8;
  undefined1 auStack_20970 [16];
  float fStack_20960;
  float fStack_2095c;
  Matrix<float,_6,_6,_0,_6,_6> MStack_20958;
  undefined1 auStack_208c8 [16];
  ulong uStack_208b8;
  undefined1 auStack_208b0 [8];
  undefined1 auStack_208a8 [8];
  undefined8 uStack_208a0;
  undefined8 uStack_20898;
  PointerType pfStack_20890;
  XprTypeNested pMStack_20880;
  variable_if_dynamic<long,__1> vStack_20878;
  variable_if_dynamic<long,__1> vStack_20870;
  Index IStack_20868;
  variable_if_dynamic<long,__1> vStack_20860;
  Index IStack_20850;
  Matrix<float,_3,_3,_0,_3,_3> *pMStack_20848;
  PointerType pfStack_20840;
  variable_if_dynamic<long,__1> vStack_20838;
  PointerType pfStack_20828;
  Matrix<float,_6,_6,_0,_6,_6> *pMStack_20818;
  variable_if_dynamic<long,__1> vStack_20810;
  variable_if_dynamic<long,__1> vStack_20808;
  Index IStack_20800;
  variable_if_dynamic<long,__1> vStack_207f8;
  Index IStack_207e8;
  PointerType pfStack_207e0;
  variable_if_dynamic<long,__1> vStack_207d8;
  PointerType pfStack_207c8;
  XprTypeNested pMStack_207b8;
  variable_if_dynamic<long,__1> vStack_207b0;
  variable_if_dynamic<long,__1> vStack_207a8;
  Index IStack_207a0;
  variable_if_dynamic<long,__1> vStack_20798;
  Index IStack_20788;
  Matrix<float,_3,_3,_0,_3,_3> *pMStack_20780;
  PointerType pfStack_20778;
  variable_if_dynamic<long,__1> vStack_20770;
  PointerType pfStack_20760;
  Matrix<float,_6,_6,_0,_6,_6> *pMStack_20750;
  variable_if_dynamic<long,__1> vStack_20748;
  variable_if_dynamic<long,__1> vStack_20740;
  Index IStack_20738;
  variable_if_dynamic<long,__1> vStack_20730;
  Index IStack_20720;
  Matrix<float,_3,_1,_0,_3,_1> MStack_20704;
  undefined1 auStack_206f8 [16];
  float *pfStack_206e8;
  float *pfStack_206d8;
  Matrix<float,_6,_1,_0,_6,_1> MStack_206c8;
  Matrix<float,_6,_3,_0,_6,_3> MStack_206b0;
  Matrix<float,_64,_64,_0,_64,_64> MStack_20668;
  undefined1 auStack_1c668 [8];
  variable_if_dynamic<long,__1> vStack_1c660;
  undefined8 uStack_1c658;
  Matrix<float,_6,_1,_0,_6,_1> *pMStack_1c650;
  variable_if_dynamic<long,__1> vStack_1c648;
  undefined8 uStack_1c640;
  Index IStack_1c638;
  undefined1 auStack_18668 [50448];
  bool local_c158;
  undefined2 local_c144;
  Index local_c140;
  EigenvectorsType local_8038;
  
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pfVar11 = *(float **)lPair;
  auStack_20970._12_4_ = *pfVar11;
  uStack_208a0 = (non_const_type)(auStack_20970 + 0xc);
  fStack_20960 = pfVar11[1];
  fStack_2095c = pfVar11[2];
  auStack_20970._0_4_ = pfVar11[4];
  auStack_208a8 = (undefined1  [8])auStack_20970;
  auStack_20970._4_4_ = pfVar11[5];
  auStack_20970._8_4_ = pfVar11[6];
  auStack_20c2c._12_4_ = pfVar11[8];
  fStack_20c1c = pfVar11[9];
  fStack_20c18 = pfVar11[10];
  auStack_20c2c._0_4_ = pfVar11[0xc];
  auStack_20c2c._4_4_ = pfVar11[0xd];
  auStack_20c2c._8_4_ = pfVar11[0xe];
  auStack_20c44._12_4_ = pfVar11[0x10];
  fStack_20c34 = pfVar11[0x11];
  fStack_20c30 = pfVar11[0x12];
  auStack_20c44._0_4_ = pfVar11[0x14];
  auStack_20c44._4_4_ = pfVar11[0x15];
  auStack_20c44._8_4_ = pfVar11[0x16];
  auStack_20c5c._12_4_ = pfVar11[0x18];
  fStack_20c4c = pfVar11[0x19];
  fStack_20c48 = pfVar11[0x1a];
  auStack_20c5c._0_4_ = pfVar11[0x1c];
  auStack_20c5c._4_4_ = pfVar11[0x1d];
  auStack_20c5c._8_4_ = pfVar11[0x1e];
  auStack_20c74._12_4_ = pfVar11[0x20];
  fStack_20c64 = pfVar11[0x21];
  fStack_20c60 = pfVar11[0x22];
  auStack_20c74._0_4_ = pfVar11[0x24];
  auStack_20c74._4_4_ = pfVar11[0x25];
  auStack_20c74._8_4_ = pfVar11[0x26];
  auStack_20c8c._12_4_ = pfVar11[0x28];
  fStack_20c7c = pfVar11[0x29];
  fStack_20c78 = pfVar11[0x2a];
  auStack_20c8c._0_4_ = pfVar11[0x2c];
  auStack_20c8c._4_4_ = pfVar11[0x2d];
  auStack_20c8c._8_4_ = pfVar11[0x2e];
  auStack_20ca4._12_4_ = pfVar11[0x30];
  fStack_20c94 = pfVar11[0x31];
  fStack_20c90 = pfVar11[0x32];
  auStack_20ca4._0_4_ = pfVar11[0x34];
  auStack_20ca4._4_4_ = pfVar11[0x35];
  auStack_20ca4._8_4_ = pfVar11[0x36];
  auStack_20cbc._12_4_ = pfVar11[0x38];
  fStack_20cac = pfVar11[0x39];
  fStack_20ca8 = pfVar11[0x3a];
  auStack_20cbc._0_4_ = pfVar11[0x3c];
  auStack_20cbc._4_4_ = pfVar11[0x3d];
  auStack_20cbc._8_4_ = pfVar11[0x3e];
  auStack_20cd4._12_4_ = pfVar11[0x40];
  fStack_20cc4 = pfVar11[0x41];
  fStack_20cc0 = pfVar11[0x42];
  auStack_20cd4._0_4_ = pfVar11[0x44];
  auStack_20cd4._4_4_ = pfVar11[0x45];
  auStack_20cd4._8_4_ = pfVar11[0x46];
  auStack_20cec._12_4_ = pfVar11[0x48];
  fStack_20cdc = pfVar11[0x49];
  fStack_20cd8 = pfVar11[0x4a];
  auStack_20cec._0_4_ = pfVar11[0x4c];
  auStack_20cec._4_4_ = pfVar11[0x4d];
  auStack_20cec._8_4_ = pfVar11[0x4e];
  auStack_20d04._12_4_ = pfVar11[0x50];
  fStack_20cf4 = pfVar11[0x51];
  fStack_20cf0 = pfVar11[0x52];
  auStack_20d04._0_4_ = pfVar11[0x54];
  auStack_20d04._4_4_ = pfVar11[0x55];
  auStack_20d04._8_4_ = pfVar11[0x56];
  auStack_20d1c._12_4_ = pfVar11[0x58];
  fStack_20d0c = pfVar11[0x59];
  fStack_20d08 = pfVar11[0x5a];
  auStack_20d1c._0_4_ = pfVar11[0x5c];
  auStack_20d1c._4_4_ = pfVar11[0x5d];
  auStack_20d1c._8_4_ = pfVar11[0x5e];
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[2] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[3] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[4] = 1.4013e-45;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[5] = 0.0;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[6] = 4.2039e-45;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[7] = 0.0;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
  vStack_1c660.m_value = 3;
  uStack_1c658 = 1;
  vStack_1c648.m_value = 0;
  uStack_1c640 = 0;
  IStack_1c638 = 6;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
  auStack_20be8._0_8_ = &MStack_209d8;
  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array._0_8_ = &MStack_209d8;
  auStack_1c668 = (undefined1  [8])&MStack_209d8;
  pMStack_1c650 = &MStack_209d8;
  local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage
  .m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)&local_8038);
  auStack_1c668 =
       (undefined1  [8])
       CONCAT44((float)auStack_20970._0_4_ * fStack_2095c -
                (float)auStack_20970._12_4_ * (float)auStack_20970._8_4_,
                (float)auStack_20970._8_4_ * fStack_20960 -
                fStack_2095c * (float)auStack_20970._4_4_);
  vStack_1c660.m_value._0_4_ =
       (float)auStack_20970._12_4_ * (float)auStack_20970._4_4_ -
       (float)auStack_20970._0_4_ * fStack_20960;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
  if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data
       .array._24_8_ +
       MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data
       .array._8_8_ == 6) &&
     (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array._16_8_ == 1)) {
    vStack_1c660.m_value = 3;
    vStack_1c648.m_value = 0;
    IStack_1c638 = 6;
    auStack_1c668 = (undefined1  [8])&MStack_209d8;
    pMStack_1c650 = &MStack_209d8;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_209d8;
    SVar16 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                         *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)auStack_1c668);
    auVar28._0_4_ = SQRT(SVar16);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
    MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
    _0_16_ = divps((undefined1  [16])
                   MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array._0_16_,auVar28);
    auVar27._8_8_ = 0;
    auVar27._0_4_ =
         MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
         array[4];
    auVar27._4_4_ =
         MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
         array[5];
    auVar28 = divps(auVar27,auVar28);
    MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array.
    _16_8_ = auVar28._0_8_;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[2] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[3] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[4] = 1.4013e-45;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[5] = 0.0;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[6] = 4.2039e-45;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[7] = 0.0;
    vStack_1c660.m_value = 3;
    uStack_1c658 = 1;
    vStack_1c648.m_value = 0;
    uStack_1c640 = 0;
    IStack_1c638 = 6;
    auStack_208a8 = (undefined1  [8])auStack_20c2c;
    uStack_208a0 = (non_const_type)(auStack_20c2c + 0xc);
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
    auStack_20be8._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209f8;
    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209f8;
    auStack_1c668 = (undefined1  [8])auStack_209f8;
    pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209f8;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
    local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
    m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)&local_8038);
    auStack_1c668 =
         (undefined1  [8])
         CONCAT44((float)auStack_20c2c._0_4_ * fStack_20c18 -
                  (float)auStack_20c2c._12_4_ * (float)auStack_20c2c._8_4_,
                  (float)auStack_20c2c._8_4_ * fStack_20c1c -
                  fStack_20c18 * (float)auStack_20c2c._4_4_);
    vStack_1c660.m_value._0_4_ =
         (float)auStack_20c2c._12_4_ * (float)auStack_20c2c._4_4_ -
         (float)auStack_20c2c._0_4_ * fStack_20c1c;
    Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
               (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
    if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
         m_data.array._24_8_ +
         MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
         m_data.array._8_8_ == 6) &&
       (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array._16_8_ == 1)) {
      vStack_1c660.m_value = 3;
      vStack_1c648.m_value = 0;
      IStack_1c638 = 6;
      auStack_1c668 = (undefined1  [8])auStack_209f8;
      pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_209f8;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_209f8;
      SVar16 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                           *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                           *)auStack_1c668);
      auVar18._0_4_ = SQRT(SVar16);
      auVar18._4_4_ = auVar18._0_4_;
      auVar18._8_4_ = auVar18._0_4_;
      auVar18._12_4_ = auVar18._0_4_;
      auStack_209f8 = divps(auStack_209f8,auVar18);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uStack_209e8;
      auVar28 = divps(auVar29,auVar18);
      uStack_209e8 = auVar28._0_8_;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[2] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[3] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[4] = 1.4013e-45;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[5] = 0.0;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[6] = 4.2039e-45;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array[7] = 0.0;
      vStack_1c660.m_value = 3;
      uStack_1c658 = 1;
      vStack_1c648.m_value = 0;
      uStack_1c640 = 0;
      IStack_1c638 = 6;
      auStack_208a8 = (undefined1  [8])auStack_20c44;
      uStack_208a0 = (non_const_type)(auStack_20c44 + 0xc);
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
      auStack_20be8._0_8_ = &MStack_20a18;
      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.
      array._0_8_ = &MStack_20a18;
      auStack_1c668 = (undefined1  [8])&MStack_20a18;
      pMStack_1c650 = &MStack_20a18;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
      local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
      m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)&local_8038);
      auStack_1c668 =
           (undefined1  [8])
           CONCAT44((float)auStack_20c44._0_4_ * fStack_20c30 -
                    (float)auStack_20c44._12_4_ * (float)auStack_20c44._8_4_,
                    (float)auStack_20c44._8_4_ * fStack_20c34 -
                    fStack_20c30 * (float)auStack_20c44._4_4_);
      vStack_1c660.m_value._0_4_ =
           (float)auStack_20c44._12_4_ * (float)auStack_20c44._4_4_ -
           (float)auStack_20c44._0_4_ * fStack_20c34;
      Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
      if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
           m_data.array._24_8_ +
           MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
           m_data.array._8_8_ == 6) &&
         (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array._16_8_ == 1)) {
        vStack_1c660.m_value = 3;
        vStack_1c648.m_value = 0;
        IStack_1c638 = 6;
        auStack_1c668 = (undefined1  [8])&MStack_20a18;
        pMStack_1c650 = &MStack_20a18;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20a18;
        SVar16 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                             *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)auStack_1c668);
        auVar19._0_4_ = SQRT(SVar16);
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        MStack_20a18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array._0_16_ = divps((undefined1  [16])
                             MStack_20a18.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array._0_16_,auVar19);
        auVar30._8_8_ = 0;
        auVar30._0_4_ =
             MStack_20a18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
             m_data.array[4];
        auVar30._4_4_ =
             MStack_20a18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
             m_data.array[5];
        auVar28 = divps(auVar30,auVar19);
        MStack_20a18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array._16_8_ = auVar28._0_8_;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[3] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[4] = 1.4013e-45;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[5] = 0.0;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[6] = 4.2039e-45;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[7] = 0.0;
        vStack_1c660.m_value = 3;
        uStack_1c658 = 1;
        vStack_1c648.m_value = 0;
        uStack_1c640 = 0;
        IStack_1c638 = 6;
        auStack_208a8 = (undefined1  [8])auStack_20c5c;
        uStack_208a0 = (non_const_type)(auStack_20c5c + 0xc);
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
        auStack_20be8._0_8_ = &MStack_20a38;
        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array._0_8_ = &MStack_20a38;
        auStack_1c668 = (undefined1  [8])&MStack_20a38;
        pMStack_1c650 = &MStack_20a38;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
        local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
        m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)&local_8038);
        auStack_1c668 =
             (undefined1  [8])
             CONCAT44((float)auStack_20c5c._0_4_ * fStack_20c48 -
                      (float)auStack_20c5c._12_4_ * (float)auStack_20c5c._8_4_,
                      (float)auStack_20c5c._8_4_ * fStack_20c4c -
                      fStack_20c48 * (float)auStack_20c5c._4_4_);
        vStack_1c660.m_value._0_4_ =
             (float)auStack_20c5c._12_4_ * (float)auStack_20c5c._4_4_ -
             (float)auStack_20c5c._0_4_ * fStack_20c4c;
        Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                   (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
        if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
             m_data.array._24_8_ +
             MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
             m_data.array._8_8_ == 6) &&
           (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array._16_8_ == 1)) {
          vStack_1c660.m_value = 3;
          vStack_1c648.m_value = 0;
          IStack_1c638 = 6;
          auStack_1c668 = (undefined1  [8])&MStack_20a38;
          pMStack_1c650 = &MStack_20a38;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20a38;
          SVar16 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                               *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                               *)auStack_1c668);
          auVar20._0_4_ = SQRT(SVar16);
          auVar20._4_4_ = auVar20._0_4_;
          auVar20._8_4_ = auVar20._0_4_;
          auVar20._12_4_ = auVar20._0_4_;
          MStack_20a38.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array._0_16_ = divps((undefined1  [16])
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array._0_16_,auVar20);
          auVar31._8_8_ = 0;
          auVar31._0_4_ =
               MStack_20a38.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
               m_data.array[4];
          auVar31._4_4_ =
               MStack_20a38.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
               m_data.array[5];
          auVar28 = divps(auVar31,auVar20);
          MStack_20a38.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array._16_8_ = auVar28._0_8_;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[3] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[4] = 1.4013e-45;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[5] = 0.0;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[6] = 4.2039e-45;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[7] = 0.0;
          vStack_1c660.m_value = 3;
          uStack_1c658 = 1;
          vStack_1c648.m_value = 0;
          uStack_1c640 = 0;
          IStack_1c638 = 6;
          auStack_208a8 = (undefined1  [8])auStack_20c74;
          uStack_208a0 = (non_const_type)(auStack_20c74 + 0xc);
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
          auStack_20be8._0_8_ = &MStack_20a58;
          MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array._0_8_ = &MStack_20a58;
          auStack_1c668 = (undefined1  [8])&MStack_20a58;
          pMStack_1c650 = &MStack_20a58;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
          local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
          m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)&local_8038);
          auStack_1c668 =
               (undefined1  [8])
               CONCAT44((float)auStack_20c74._0_4_ * fStack_20c60 -
                        (float)auStack_20c74._12_4_ * (float)auStack_20c74._8_4_,
                        (float)auStack_20c74._8_4_ * fStack_20c64 -
                        fStack_20c60 * (float)auStack_20c74._4_4_);
          vStack_1c660.m_value._0_4_ =
               (float)auStack_20c74._12_4_ * (float)auStack_20c74._4_4_ -
               (float)auStack_20c74._0_4_ * fStack_20c64;
          Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                     (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
          if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array._24_8_ +
               MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array._8_8_ == 6) &&
             (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array._16_8_ == 1)) {
            vStack_1c660.m_value = 3;
            vStack_1c648.m_value = 0;
            IStack_1c638 = 6;
            auStack_1c668 = (undefined1  [8])&MStack_20a58;
            pMStack_1c650 = &MStack_20a58;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20a58;
            SVar16 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                 *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                 *)auStack_1c668);
            auVar21._0_4_ = SQRT(SVar16);
            auVar21._4_4_ = auVar21._0_4_;
            auVar21._8_4_ = auVar21._0_4_;
            auVar21._12_4_ = auVar21._0_4_;
            MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array._0_16_ =
                 divps((undefined1  [16])
                       MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array._0_16_,auVar21);
            auVar32._8_8_ = 0;
            auVar32._0_4_ =
                 MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[4];
            auVar32._4_4_ =
                 MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[5];
            auVar28 = divps(auVar32,auVar21);
            MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
            m_data.array._16_8_ = auVar28._0_8_;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[3] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[4] = 1.4013e-45;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[5] = 0.0;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[6] = 4.2039e-45;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[7] = 0.0;
            vStack_1c660.m_value = 3;
            uStack_1c658 = 1;
            vStack_1c648.m_value = 0;
            uStack_1c640 = 0;
            IStack_1c638 = 6;
            auStack_208a8 = (undefined1  [8])auStack_20c8c;
            uStack_208a0 = (non_const_type)(auStack_20c8c + 0xc);
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
            auStack_20be8._0_8_ = &MStack_20a78;
            MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array._0_8_ = &MStack_20a78;
            auStack_1c668 = (undefined1  [8])&MStack_20a78;
            pMStack_1c650 = &MStack_20a78;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
            local_8038.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
            .m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)&local_8038);
            auStack_1c668 =
                 (undefined1  [8])
                 CONCAT44((float)auStack_20c8c._0_4_ * fStack_20c78 -
                          (float)auStack_20c8c._12_4_ * (float)auStack_20c8c._8_4_,
                          (float)auStack_20c8c._8_4_ * fStack_20c7c -
                          fStack_20c78 * (float)auStack_20c8c._4_4_);
            vStack_1c660.m_value._0_4_ =
                 (float)auStack_20c8c._12_4_ * (float)auStack_20c8c._4_4_ -
                 (float)auStack_20c8c._0_4_ * fStack_20c7c;
            Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                       (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
            if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array._24_8_ +
                 MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array._8_8_ == 6) &&
               (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array._16_8_ == 1)) {
              vStack_1c660.m_value = 3;
              vStack_1c648.m_value = 0;
              IStack_1c638 = 6;
              auStack_1c668 = (undefined1  [8])&MStack_20a78;
              pMStack_1c650 = &MStack_20a78;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20a78;
              SVar16 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                   *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                   *)auStack_1c668);
              auVar40._0_4_ = SQRT(SVar16);
              auVar40._4_4_ = auVar40._0_4_;
              auVar40._8_4_ = auVar40._0_4_;
              auVar40._12_4_ = auVar40._0_4_;
              MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array._0_16_ =
                   divps((undefined1  [16])
                         MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array._0_16_,auVar40);
              auVar33._8_8_ = 0;
              auVar33._0_4_ =
                   MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[4];
              auVar33._4_4_ =
                   MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[5];
              auVar28 = divps(auVar33,auVar40);
              MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array._16_8_ = auVar28._0_8_;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[2] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[3] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[4] = 1.4013e-45;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[5] = 0.0;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[6] = 4.2039e-45;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array[7] = 0.0;
              vStack_1c660.m_value = 3;
              uStack_1c658 = 1;
              vStack_1c648.m_value = 0;
              uStack_1c640 = 0;
              IStack_1c638 = 6;
              auStack_208a8 = (undefined1  [8])auStack_20ca4;
              uStack_208a0 = (non_const_type)(auStack_20ca4 + 0xc);
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
              auStack_20be8._0_8_ = &MStack_20a98;
              MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
              .m_data.array._0_8_ = &MStack_20a98;
              auStack_1c668 = (undefined1  [8])&MStack_20a98;
              pMStack_1c650 = &MStack_20a98;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
              local_8038.
              super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                     *)&local_8038);
              auStack_1c668 =
                   (undefined1  [8])
                   CONCAT44((float)auStack_20ca4._0_4_ * fStack_20c90 -
                            (float)auStack_20ca4._12_4_ * (float)auStack_20ca4._8_4_,
                            (float)auStack_20ca4._8_4_ * fStack_20c94 -
                            fStack_20c90 * (float)auStack_20ca4._4_4_);
              vStack_1c660.m_value._0_4_ =
                   (float)auStack_20ca4._12_4_ * (float)auStack_20ca4._4_4_ -
                   (float)auStack_20ca4._0_4_ * fStack_20c94;
              Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                         (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
              if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array._24_8_ +
                   MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array._8_8_ == 6) &&
                 (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array._16_8_ == 1)) {
                vStack_1c660.m_value = 3;
                vStack_1c648.m_value = 0;
                IStack_1c638 = 6;
                auStack_1c668 = (undefined1  [8])&MStack_20a98;
                pMStack_1c650 = &MStack_20a98;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20a98;
                SVar16 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                     *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                     *)auStack_1c668);
                auVar22._0_4_ = SQRT(SVar16);
                auVar22._4_4_ = auVar22._0_4_;
                auVar22._8_4_ = auVar22._0_4_;
                auVar22._12_4_ = auVar22._0_4_;
                MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array._0_16_ =
                     divps((undefined1  [16])
                           MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array._0_16_,auVar22);
                auVar34._8_8_ = 0;
                auVar34._0_4_ =
                     MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[4];
                auVar34._4_4_ =
                     MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[5];
                auVar28 = divps(auVar34,auVar22);
                MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array._16_8_ = auVar28._0_8_;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[4] = 1.4013e-45;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[5] = 0.0;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[6] = 4.2039e-45;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[7] = 0.0;
                vStack_1c660.m_value = 3;
                uStack_1c658 = 1;
                vStack_1c648.m_value = 0;
                uStack_1c640 = 0;
                IStack_1c638 = 6;
                auStack_208a8 = (undefined1  [8])auStack_20cbc;
                uStack_208a0 = (non_const_type)(auStack_20cbc + 0xc);
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
                auStack_20be8._0_8_ = &MStack_20ab8;
                MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array._0_8_ = &MStack_20ab8;
                auStack_1c668 = (undefined1  [8])&MStack_20ab8;
                pMStack_1c650 = &MStack_20ab8;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                local_8038.
                super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)&local_8038);
                auStack_1c668 =
                     (undefined1  [8])
                     CONCAT44((float)auStack_20cbc._0_4_ * fStack_20ca8 -
                              (float)auStack_20cbc._12_4_ * (float)auStack_20cbc._8_4_,
                              (float)auStack_20cbc._8_4_ * fStack_20cac -
                              fStack_20ca8 * (float)auStack_20cbc._4_4_);
                vStack_1c660.m_value._0_4_ =
                     (float)auStack_20cbc._12_4_ * (float)auStack_20cbc._4_4_ -
                     (float)auStack_20cbc._0_4_ * fStack_20cac;
                Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                           (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array._24_8_ +
                     MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array._8_8_ == 6) &&
                   (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array._16_8_ == 1)) {
                  vStack_1c660.m_value = 3;
                  vStack_1c648.m_value = 0;
                  IStack_1c638 = 6;
                  auStack_1c668 = (undefined1  [8])&MStack_20ab8;
                  pMStack_1c650 = &MStack_20ab8;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20ab8;
                  SVar16 = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                       *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                       *)auStack_1c668);
                  auVar23._0_4_ = SQRT(SVar16);
                  auVar23._4_4_ = auVar23._0_4_;
                  auVar23._8_4_ = auVar23._0_4_;
                  auVar23._12_4_ = auVar23._0_4_;
                  MStack_20ab8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                  .m_data.array._0_16_ =
                       divps((undefined1  [16])
                             MStack_20ab8.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array._0_16_,auVar23);
                  auVar35._8_8_ = 0;
                  auVar35._0_4_ =
                       MStack_20ab8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[4];
                  auVar35._4_4_ =
                       MStack_20ab8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[5];
                  auVar28 = divps(auVar35,auVar23);
                  MStack_20ab8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                  .m_data.array._16_8_ = auVar28._0_8_;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[4] = 1.4013e-45;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[5] = 0.0;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[6] = 4.2039e-45;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[7] = 0.0;
                  vStack_1c660.m_value = 3;
                  uStack_1c658 = 1;
                  vStack_1c648.m_value = 0;
                  uStack_1c640 = 0;
                  IStack_1c638 = 6;
                  auStack_208a8 = (undefined1  [8])auStack_20cd4;
                  uStack_208a0 = (non_const_type)(auStack_20cd4 + 0xc);
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
                  auStack_20be8._0_8_ = &MStack_20ad8;
                  MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array._0_8_ = &MStack_20ad8;
                  auStack_1c668 = (undefined1  [8])&MStack_20ad8;
                  pMStack_1c650 = &MStack_20ad8;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                  local_8038.
                  super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                         *)&local_8038);
                  auStack_1c668 =
                       (undefined1  [8])
                       CONCAT44((float)auStack_20cd4._0_4_ * fStack_20cc0 -
                                (float)auStack_20cd4._12_4_ * (float)auStack_20cd4._8_4_,
                                (float)auStack_20cd4._8_4_ * fStack_20cc4 -
                                fStack_20cc0 * (float)auStack_20cd4._4_4_);
                  vStack_1c660.m_value._0_4_ =
                       (float)auStack_20cd4._12_4_ * (float)auStack_20cd4._4_4_ -
                       (float)auStack_20cd4._0_4_ * fStack_20cc4;
                  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                  if ((MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                       m_storage.m_data.array._24_8_ +
                       MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                       m_storage.m_data.array._8_8_ == 6) &&
                     (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array._16_8_ == 1)) {
                    vStack_1c660.m_value = 3;
                    vStack_1c648.m_value = 0;
                    IStack_1c638 = 6;
                    auStack_1c668 = (undefined1  [8])&MStack_20ad8;
                    pMStack_1c650 = &MStack_20ad8;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20ad8;
                    SVar16 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                         *)&local_8038,(scalar_sum_op<float,_float> *)&MStack_20668,
                                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                         *)auStack_1c668);
                    auVar24._0_4_ = SQRT(SVar16);
                    auVar24._4_4_ = auVar24._0_4_;
                    auVar24._8_4_ = auVar24._0_4_;
                    auVar24._12_4_ = auVar24._0_4_;
                    MStack_20ad8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array._0_16_ =
                         divps((undefined1  [16])
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array._0_16_,auVar24);
                    auVar36._8_8_ = 0;
                    auVar36._0_4_ =
                         MStack_20ad8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array[4];
                    auVar36._4_4_ =
                         MStack_20ad8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array[5];
                    auVar28 = divps(auVar36,auVar24);
                    MStack_20ad8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array._16_8_ = auVar28._0_8_;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[4] = 1.4013e-45;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[5] = 0.0;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[6] = 4.2039e-45;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[7] = 0.0;
                    vStack_1c660.m_value = 3;
                    uStack_1c658 = 1;
                    vStack_1c648.m_value = 0;
                    uStack_1c640 = 0;
                    IStack_1c638 = 6;
                    auStack_208a8 = (undefined1  [8])auStack_20cec;
                    uStack_208a0 = (non_const_type)(auStack_20cec + 0xc);
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
                    auStack_20be8._0_8_ = &MStack_20af8;
                    MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array._0_8_ = &MStack_20af8;
                    auStack_1c668 = (undefined1  [8])&MStack_20af8;
                    pMStack_1c650 = &MStack_20af8;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                    local_8038.
                    super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                    Eigen::internal::
                    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                           *)&local_8038);
                    auStack_1c668 =
                         (undefined1  [8])
                         CONCAT44((float)auStack_20cec._0_4_ * fStack_20cd8 -
                                  (float)auStack_20cec._12_4_ * (float)auStack_20cec._8_4_,
                                  (float)auStack_20cec._8_4_ * fStack_20cdc -
                                  fStack_20cd8 * (float)auStack_20cec._4_4_);
                    vStack_1c660.m_value._0_4_ =
                         (float)auStack_20cec._12_4_ * (float)auStack_20cec._4_4_ -
                         (float)auStack_20cec._0_4_ * fStack_20cdc;
                    Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                               (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                    if ((MStack_20668.
                         super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array._24_8_ +
                         MStack_20668.
                         super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array._8_8_ == 6) &&
                       (MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array._16_8_ == 1)) {
                      vStack_1c660.m_value = 3;
                      vStack_1c648.m_value = 0;
                      IStack_1c638 = 6;
                      auStack_1c668 = (undefined1  [8])&MStack_20af8;
                      pMStack_1c650 = &MStack_20af8;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20af8;
                      SVar16 = Eigen::internal::
                               redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                               ::
                               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                           *)&local_8038,
                                          (scalar_sum_op<float,_float> *)&MStack_20668,
                                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                           *)auStack_1c668);
                      auVar25._0_4_ = SQRT(SVar16);
                      auVar25._4_4_ = auVar25._0_4_;
                      auVar25._8_4_ = auVar25._0_4_;
                      auVar25._12_4_ = auVar25._0_4_;
                      MStack_20af8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array._0_16_ =
                           divps((undefined1  [16])
                                 MStack_20af8.
                                 super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array._0_16_,auVar25);
                      auVar37._8_8_ = 0;
                      auVar37._0_4_ =
                           MStack_20af8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[4];
                      auVar37._4_4_ =
                           MStack_20af8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                           m_storage.m_data.array[5];
                      auVar28 = divps(auVar37,auVar25);
                      MStack_20af8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array._16_8_ = auVar28._0_8_;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[4] = 1.4013e-45;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[5] = 0.0;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[6] = 4.2039e-45;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[7] = 0.0;
                      vStack_1c660.m_value = 3;
                      uStack_1c658 = 1;
                      vStack_1c648.m_value = 0;
                      uStack_1c640 = 0;
                      IStack_1c638 = 6;
                      auStack_208a8 = (undefined1  [8])auStack_20d04;
                      uStack_208a0 = (non_const_type)(auStack_20d04 + 0xc);
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
                      auStack_20be8._0_8_ = &MStack_20b18;
                      MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array._0_8_ = &MStack_20b18;
                      auStack_1c668 = (undefined1  [8])&MStack_20b18;
                      pMStack_1c650 = &MStack_20b18;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                      local_8038.
                      super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                             *)&local_8038);
                      auStack_1c668 =
                           (undefined1  [8])
                           CONCAT44((float)auStack_20d04._0_4_ * fStack_20cf0 -
                                    (float)auStack_20d04._12_4_ * (float)auStack_20d04._8_4_,
                                    (float)auStack_20d04._8_4_ * fStack_20cf4 -
                                    fStack_20cf0 * (float)auStack_20d04._4_4_);
                      vStack_1c660.m_value._0_4_ =
                           (float)auStack_20d04._12_4_ * (float)auStack_20d04._4_4_ -
                           (float)auStack_20d04._0_4_ * fStack_20cf4;
                      Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668,
                                 (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668);
                      if ((MStack_20668.
                           super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
                           .m_data.array._24_8_ +
                           MStack_20668.
                           super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage
                           .m_data.array._8_8_ == 6) &&
                         (MStack_20668.
                          super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.
                          m_data.array._16_8_ == 1)) {
                        vStack_1c660.m_value = 3;
                        vStack_1c648.m_value = 0;
                        IStack_1c638 = 6;
                        auStack_1c668 = (undefined1  [8])&MStack_20b18;
                        pMStack_1c650 = &MStack_20b18;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[1]._M_value = (_ComplexT)&MStack_20b18;
                        SVar16 = Eigen::internal::
                                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                                 ::
                                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                             *)&local_8038,
                                            (scalar_sum_op<float,_float> *)&MStack_20668,
                                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                             *)auStack_1c668);
                        auVar26._0_4_ = SQRT(SVar16);
                        auVar26._4_4_ = auVar26._0_4_;
                        auVar26._8_4_ = auVar26._0_4_;
                        auVar26._12_4_ = auVar26._0_4_;
                        MStack_20b18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array._0_16_ =
                             divps((undefined1  [16])
                                   MStack_20b18.
                                   super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                   m_storage.m_data.array._0_16_,auVar26);
                        auVar38._8_8_ = 0;
                        auVar38._0_4_ =
                             MStack_20b18.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[4];
                        auVar38._4_4_ =
                             MStack_20b18.
                             super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                             m_data.array[5];
                        auVar28 = divps(auVar38,auVar26);
                        MStack_20b18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array._16_8_ = auVar28._0_8_;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[2] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[3] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[4] = 1.4013e-45;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[5] = 0.0;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[6] = 4.2039e-45;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[7] = 0.0;
                        vStack_1c660.m_value = 3;
                        uStack_1c658 = 1;
                        vStack_1c648.m_value = 0;
                        uStack_1c640 = 0;
                        IStack_1c638 = 6;
                        auStack_208a8 = (undefined1  [8])auStack_20d1c;
                        uStack_208a0 = (non_const_type)(auStack_20d1c + 0xc);
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[0]._M_value = (_ComplexT)auStack_20be8;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[2]._M_value = (_ComplexT)&MStack_20958;
                        auStack_20be8._0_8_ = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_208c8;
                        MStack_20668.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array._0_8_ =
                             (Matrix<float,_6,_1,_0,_6,_1> *)auStack_208c8;
                        auStack_1c668 = (undefined1  [8])auStack_208c8;
                        pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_208c8;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208b0;
                        local_8038.
                        super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                        .m_storage.m_data.array[3]._M_value = (_ComplexT)auStack_1c668;
                        Eigen::internal::
                        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
                               *)&local_8038);
                        auStack_1c668 =
                             (undefined1  [8])
                             CONCAT44((float)auStack_20d1c._0_4_ * fStack_20d08 -
                                      (float)auStack_20d1c._12_4_ * (float)auStack_20d1c._8_4_,
                                      (float)auStack_20d1c._8_4_ * fStack_20d0c -
                                      fStack_20d08 * (float)auStack_20d1c._4_4_);
                        vStack_1c660.m_value._0_4_ =
                             (float)auStack_20d1c._12_4_ * (float)auStack_20d1c._4_4_ -
                             (float)auStack_20d1c._0_4_ * fStack_20d0c;
                        Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&MStack_20668
                                   ,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)auStack_1c668
                                  );
                        if ((MStack_20668.
                             super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array._24_8_ +
                             MStack_20668.
                             super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array._8_8_ == 6) &&
                           (MStack_20668.
                            super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.
                            m_storage.m_data.array._16_8_ == 1)) {
                          vStack_1c660.m_value = 3;
                          vStack_1c648.m_value = 0;
                          IStack_1c638 = 6;
                          auStack_1c668 = (undefined1  [8])auStack_208c8;
                          pMStack_1c650 = (Matrix<float,_6,_1,_0,_6,_1> *)auStack_208c8;
                          local_8038.
                          super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                          .m_storage.m_data.array[1]._M_value = (_ComplexT)auStack_208c8;
                          SVar16 = Eigen::internal::
                                   redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
                                   ::
                                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                               *)&local_8038,
                                              (scalar_sum_op<float,_float> *)&MStack_20668,
                                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                               *)auStack_1c668);
                          auVar32 = (undefined1  [16])
                                    MStack_209d8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar21 = (undefined1  [16])
                                    MStack_20a18.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar31 = (undefined1  [16])
                                    MStack_20a38.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar20 = (undefined1  [16])
                                    MStack_20a58.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar30 = (undefined1  [16])
                                    MStack_20a78.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar19 = (undefined1  [16])
                                    MStack_20a98.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar29 = (undefined1  [16])
                                    MStack_20ab8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar18 = (undefined1  [16])
                                    MStack_20ad8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar27 = (undefined1  [16])
                                    MStack_20af8.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          auVar28 = (undefined1  [16])
                                    MStack_20b18.
                                    super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                    m_storage.m_data.array._0_16_;
                          fVar41 = SQRT(SVar16);
                          auVar6._4_4_ = fVar41;
                          auVar6._0_4_ = fVar41;
                          auVar6._8_4_ = fVar41;
                          auVar6._12_4_ = fVar41;
                          auStack_208c8 = divps(auStack_208c8,auVar6);
                          auVar39._8_8_ = 0;
                          auVar39._0_8_ = uStack_208b8;
                          auVar7._4_4_ = fVar41;
                          auVar7._0_4_ = fVar41;
                          auVar7._8_4_ = fVar41;
                          auVar7._12_4_ = fVar41;
                          auVar40 = divps(auVar39,auVar7);
                          uVar17 = auVar40._0_8_;
                          uStack_208b8._0_4_ = (float)uVar17;
                          uStack_208b8._4_4_ = SUB84(uVar17,4);
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[1] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[2] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[3] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[4] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[5] =
                               MStack_209d8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          auStack_20be8._0_8_ = auStack_209f8._0_8_;
                          auStack_20be8._8_8_ = auStack_209f8._8_8_;
                          uStack_20bd8 = uStack_209e8;
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[6] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[7] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[8] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[9] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[10] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xb] =
                               MStack_20a18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20bd0[0] =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20bd0[1] =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20bc8[0] =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20bc8[1] =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          uStack_20bc0._0_4_ =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          uStack_20bc0._4_4_ =
                               MStack_20a38.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xc] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xd] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xe] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xf] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x10] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x11] =
                               MStack_20a58.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20bb8[0] =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20bb8[1] =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20bb0[0] =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20bb0[1] =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          uStack_20ba8._0_4_ =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          uStack_20ba8._4_4_ =
                               MStack_20a78.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x12] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x13] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x14] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x15] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x16] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x17] =
                               MStack_20a98.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20ba0[0] =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20ba0[1] =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20b98[0] =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20b98[1] =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          uStack_20b90._0_4_ =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          uStack_20b90._4_4_ =
                               MStack_20ab8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x18] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x19] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1a] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1b] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1c] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1d] =
                               MStack_20ad8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          afStack_20b88[0] =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          afStack_20b88[1] =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          afStack_20b80[0] =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          afStack_20b80[1] =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          uStack_20b78._0_4_ =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          uStack_20b78._4_4_ =
                               MStack_20af8.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1e] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[0];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1f] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[1];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x20] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[2];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x21] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[3];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x22] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[4];
                          MStack_20958.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x23] =
                               MStack_20b18.
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage
                               .m_data.array[5];
                          auStack_20b70 = auStack_208c8;
                          afStack_20b60[0] = (float)uVar17;
                          afStack_20b60[1] = SUB84(uVar17,4);
                          vStack_20b38.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_20b38.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_20b38.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_20b58.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          vStack_20b58.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_20b58.
                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<float,_6,_1,_0,_6,_1> *)0x0;
                          lVar13 = 0x10;
                          MStack_20b18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar28;
                          MStack_20af8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar27;
                          MStack_20ad8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar18;
                          MStack_20ab8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar29;
                          MStack_20a98.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar19;
                          MStack_20a78.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar30;
                          MStack_20a58.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar20;
                          MStack_20a38.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar31;
                          MStack_20a18.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar21;
                          MStack_209d8.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array._0_16_ = auVar32;
                          do {
                            auStack_1c668 =
                                 *(undefined1 (*) [8])
                                  ((long)MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + lVar13 + 0x1c);
                            vStack_1c660.m_value = *(long *)((long)&pcStack_20bf0 + lVar13);
                            uStack_1c658 = *(undefined8 *)(auStack_20be8 + lVar13);
                            if (vStack_20b38.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_20b38.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                                          *)&vStack_20b38,
                                         (iterator)
                                         vStack_20b38.
                                         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<float,_6,_1,_0,_6,_1> *)auStack_1c668);
                            }
                            else {
                              pDVar9 = &((vStack_20b38.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage;
                              (pDVar9->m_data).array[4] = (float)(int)uStack_1c658;
                              (pDVar9->m_data).array[5] = (float)SUB84(uStack_1c658,4);
                              *(undefined1 (*) [8])
                               ((vStack_20b38.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                               m_storage.m_data.array = auStack_1c668;
                              *(long *)(((vStack_20b38.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage.m_data.array + 2) = vStack_1c660.m_value;
                              vStack_20b38.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_20b38.
                                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            auStack_1c668 = *(undefined1 (*) [8])(auStack_20970 + lVar13 + 8);
                            vStack_1c660.m_value = *(long *)((long)&fStack_20960 + lVar13);
                            uStack_1c658 = *(undefined8 *)
                                            ((long)MStack_20958.
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar13);
                            if (vStack_20b58.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_20b58.
                                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<float,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                                          *)&vStack_20b58,
                                         (iterator)
                                         vStack_20b58.
                                         super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<float,_6,_1,_0,_6,_1> *)auStack_1c668);
                            }
                            else {
                              pDVar9 = &((vStack_20b58.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage;
                              (pDVar9->m_data).array[4] = (float)(int)uStack_1c658;
                              (pDVar9->m_data).array[5] = (float)SUB84(uStack_1c658,4);
                              *(undefined1 (*) [8])
                               ((vStack_20b58.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->
                               super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                               m_storage.m_data.array = auStack_1c668;
                              *(long *)(((vStack_20b58.
                                          super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>)
                                        .m_storage.m_data.array + 2) = vStack_1c660.m_value;
                              vStack_20b58.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_20b58.
                                   super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            lVar13 = lVar13 + 0x18;
                          } while (lVar13 != 0xa0);
                          memset(&MStack_20668,0,0x4000);
                          setupAction<float>(&vStack_20b38,&vStack_20b58,&MStack_20668);
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0] = 1.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[3] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[4] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[5] = 1.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[6] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[7] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[8] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[9] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[10] = 1.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xb] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xc] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xd] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xe] = 0.0;
                          MStack_209b8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xf] = 1.0;
                          local_c158 = false;
                          local_c144._0_1_ = false;
                          local_c144._1_1_ = false;
                          memset(auStack_18668,0,0x202);
                          local_c140 = -1;
                          Eigen::EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>::
                          compute<Eigen::Matrix<float,64,64,0,64,64>>
                                    ((EigenSolver<Eigen::Matrix<float,64,64,0,64,64>> *)
                                     auStack_1c668,
                                     (EigenBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)
                                     &MStack_20668,true);
                          Eigen::EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::eigenvectors
                                    (&local_8038,
                                     (EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)
                                     auStack_1c668);
                          std::
                          vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          ::reserve(__return_storage_ptr__,0x40);
                          pcStack_20bf0 =
                               local_8038.
                               super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>
                               .m_storage.m_data.array + 0x3c;
                          uVar12 = 0;
                          do {
                            uVar14 = 0;
                            bVar10 = 0;
                            uStack_20d28 = uVar12;
                            do {
                              bVar8 = bVar10;
                              if (0x3f < (uVar14 | uStack_20d28)) {
                                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()"
                                              ,
                                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h"
                                              ,0x16f,
                                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<float>, 64, 64, 0, 64, 64>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<std::complex<float>, 64, 64, 0, 64, 64>, Level = 1]"
                                             );
                              }
                              uVar17 = __divsc3();
                              fVar41 = (float)uVar17;
                              MStack_20704.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                              m_data.array[uVar14] = fVar41;
                              bVar5 = 1e-06 <= ABS((float)((ulong)uVar17 >> 0x20));
                              uVar14 = uVar14 + 1;
                              bVar10 = bVar8 | NAN(fVar41) | bVar5;
                            } while (uVar14 != 3);
                            uVar12 = uStack_20d28;
                            if (!(bool)(bVar8 | NAN(fVar41) | bVar5)) {
                              cayley2rot<float>(&MStack_20704);
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[4] = (float)uStack_208a0;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[5] = uStack_20898._4_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[6] = (float)auStack_208a8._0_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[7] = uStack_208a0._4_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[0] = (float)auStack_208b0._0_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[1] = (float)auStack_208a8._4_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[2] = (float)uStack_20898;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[3] = (float)auStack_208b0._4_4_;
                              MStack_20c14.
                              super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                              m_data.array[8] = pfStack_20890._0_4_;
                              lVar15 = 0;
                              lVar13 = 0;
                              do {
                                pfStack_20890 = (PointerType)(auStack_20be8 + lVar15);
                                auStack_208a8 = (undefined1  [8])(auStack_20be8 + lVar15 + 0xc);
                                pfStack_20840 =
                                     (PointerType)
                                     ((long)MStack_20958.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar15);
                                pfStack_20778 =
                                     (PointerType)
                                     ((long)MStack_20958.
                                            super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar15 + 0xc);
                                uStack_208a0 = (non_const_type)0x3;
                                vStack_20878.m_value = 0;
                                IStack_20868 = 6;
                                vStack_20860.m_value = 3;
                                IStack_20850 = 6;
                                pMStack_20848 = &MStack_20c14;
                                vStack_20838.m_value = 3;
                                pMStack_20818 = &MStack_20958;
                                vStack_20810.m_value = 0;
                                IStack_20800 = 6;
                                vStack_207f8.m_value = 0;
                                IStack_207e8 = 6;
                                vStack_207d8.m_value = 3;
                                vStack_207b0.m_value = 0;
                                IStack_207a0 = 6;
                                vStack_20798.m_value = 0;
                                IStack_20788 = 6;
                                vStack_20770.m_value = 3;
                                vStack_20748.m_value = 0;
                                IStack_20738 = 6;
                                vStack_20730.m_value = 3;
                                IStack_20720 = 6;
                                pMStack_20880 = (XprTypeNested)auStack_20be8;
                                vStack_20870.m_value = lVar13;
                                pfStack_20828 = pfStack_20840;
                                vStack_20808.m_value = lVar13;
                                pfStack_207e0 = pfStack_20890;
                                pfStack_207c8 = pfStack_20890;
                                pMStack_207b8 = (XprTypeNested)auStack_20be8;
                                vStack_207a8.m_value = lVar13;
                                pMStack_20780 = pMStack_20848;
                                pfStack_20760 = pfStack_20840;
                                pMStack_20750 = pMStack_20818;
                                vStack_20740.m_value = lVar13;
                                Eigen::internal::
                                binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                                ::Data::Data((Data *)(auStack_206f8 + 8),(XprType *)auStack_208a8);
                                MStack_206c8.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.
                                m_storage.m_data.array[lVar13] = -(*pfStack_206e8 + *pfStack_206d8);
                                fVar41 = *(float *)(auStack_20be8 + lVar15);
                                fVar1 = *(float *)(auStack_20be8 + lVar15 + 4);
                                fVar2 = *(float *)(auStack_20be8 + lVar15 + 8);
                                fVar43 = *(float *)((long)MStack_20958.
                                                                                                                    
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar15);
                                fVar3 = *(float *)((long)MStack_20958.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar15 + 4);
                                fVar4 = *(float *)((long)MStack_20958.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>
                                                  .m_storage.m_data.array + lVar15 + 8);
                                fVar42 = MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[6] * fVar4 +
                                         MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[3] * fVar3 +
                                         MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[0] * fVar43;
                                fVar44 = MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[7] * fVar4 +
                                         MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[4] * fVar3 +
                                         MStack_20c14.
                                         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array[1] * fVar43;
                                fVar43 = fVar4 * MStack_20c14.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[8] +
                                         fVar3 * MStack_20c14.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[5] +
                                         fVar43 * MStack_20c14.
                                                  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                                  .m_storage.m_data.array[2];
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar13] = fVar2 * fVar44 - fVar43 * fVar1;
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar13 + 6] =
                                     fVar41 * fVar43 - fVar2 * fVar42;
                                MStack_206b0.
                                super_PlainObjectBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[lVar13 + 0xc] =
                                     fVar42 * fVar1 - fVar44 * fVar41;
                                lVar13 = lVar13 + 1;
                                lVar15 = lVar15 + 0x18;
                              } while (lVar15 != 0x90);
                              auStack_208b0 = (undefined1  [8])&MStack_206b0;
                              uStack_20898 = &MStack_206c8;
                              auStack_208a8 = auStack_208b0;
                              uStack_208a0 = (non_const_type)auStack_208b0;
                              Eigen::internal::
                              call_dense_assignment_loop<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,0>,Eigen::Matrix<float,6,1,0,6,1>,1>,Eigen::internal::assign_op<float,float>>
                                        ((Matrix<float,_3,_1,_0,_3,_1> *)auStack_206f8,
                                         (Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>
                                          *)auStack_208b0,&aStack_20d29);
                              uVar12 = uStack_20d28;
                              lVar13 = 0;
                              pfVar11 = (float *)&MStack_20c14;
                              do {
                                *(float *)((long)MStack_209b8.
                                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                                 .m_storage.m_data.array + lVar13 + 8) = pfVar11[2];
                                *(undefined8 *)
                                 ((long)MStack_209b8.
                                        super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                        m_storage.m_data.array + lVar13) = *(undefined8 *)pfVar11;
                                pfVar11 = pfVar11 + 3;
                                lVar13 = lVar13 + 0x10;
                              } while (lVar13 != 0x30);
                              MStack_209b8.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                              m_data.array[0xc] = (float)auStack_206f8._0_8_;
                              MStack_209b8.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                              m_data.array[0xd] = SUB84(auStack_206f8._0_8_,4);
                              MStack_209b8.
                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                              m_data.array[0xe] = (float)auStack_206f8._8_4_;
                              __position._M_current =
                                   (__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                              if (__position._M_current ==
                                  (__return_storage_ptr__->
                                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::
                                vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                ::_M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                                          ((vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                                            *)__return_storage_ptr__,__position,&MStack_209b8);
                              }
                              else {
                                *(undefined8 *)
                                 (((__position._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array + 0xc) = auStack_206f8._0_8_;
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 0xe) =
                                     CONCAT44(MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[0xf],auStack_206f8._8_4_);
                                *(undefined8 *)
                                 (((__position._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array + 8) =
                                     MStack_209b8.
                                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                     m_storage.m_data.array._32_8_;
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 10) =
                                     CONCAT44(MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[0xb],
                                              MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[10]);
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 4) =
                                     CONCAT44(MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[5],
                                              MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[4]);
                                *(undefined8 *)
                                 (((__position._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array + 6) =
                                     MStack_209b8.
                                     super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                                     m_storage.m_data.array._24_8_;
                                *(ulong *)((__position._M_current)->
                                          super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                          ).m_storage.m_data.array =
                                     CONCAT44(MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[1],
                                              MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[0]);
                                *(ulong *)(((__position._M_current)->
                                           super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                           ).m_storage.m_data.array + 2) =
                                     CONCAT44(MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[3],
                                              MStack_209b8.
                                              super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
                                              .m_storage.m_data.array[2]);
                                (__return_storage_ptr__->
                                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish =
                                     __position._M_current + 1;
                              }
                            }
                            uVar12 = uVar12 + 1;
                            pcStack_20bf0 = pcStack_20bf0 + 0x40;
                          } while (uVar12 != 0x40);
                          if (vStack_20b58.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_20b58.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (vStack_20b38.
                              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_20b38.
                                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          return __return_storage_ptr__;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 6, 1>>::finished() [MatrixType = Eigen::Matrix<float, 6, 1>]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}